

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall BasePort::ReScanNodes(BasePort *this,string *caller)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  bool ret;
  uint oldFwBusGeneration;
  string *caller_local;
  BasePort *this_local;
  
  uVar1 = this->FwBusGeneration;
  (*this->_vptr_BasePort[0x13])(this,(ulong)this->newFwBusGeneration);
  uVar2 = (*this->_vptr_BasePort[3])();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(this->outStr,(string *)caller);
    poVar3 = std::operator<<(poVar3,": failed to rescan nodes");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    (*this->_vptr_BasePort[0x13])(this,(ulong)uVar1);
  }
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool BasePort::ReScanNodes(const std::string &caller)
{
    unsigned int oldFwBusGeneration = FwBusGeneration;
    UpdateBusGeneration(newFwBusGeneration);
    bool ret = ScanNodes();
    if (!ret) {
        outStr << caller << ": failed to rescan nodes" << std::endl;
        UpdateBusGeneration(oldFwBusGeneration);
    }
    return ret;
}